

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O2

void duckdb::MapKeyValueFunction
               (DataChunk *args,ExpressionState *state,Vector *result,
               _func_Vector_ptr_Vector_ptr *get_child_vector)

{
  idx_t count;
  bool bVar1;
  reference this;
  Vector *pVVar2;
  idx_t size;
  UnifiedVectorFormat map_data;
  Vector child;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  if ((this->type).id_ == SQLNULL) {
    Vector::SetVectorType((Vector *)state,CONSTANT_VECTOR);
    ConstantVector::SetNull((Vector *)state,true);
    return;
  }
  count = args->count;
  pVVar2 = (Vector *)(*(code *)result)(this);
  Vector::Vector(&child,pVVar2);
  pVVar2 = ListVector::GetEntry((Vector *)state);
  Vector::Reference(pVVar2,&child);
  UnifiedVectorFormat::UnifiedVectorFormat(&map_data);
  Vector::ToUnifiedFormat(this,count,&map_data);
  (state->child_states).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)map_data.data;
  FlatVector::SetValidity((Vector *)state,&map_data.validity);
  size = ListVector::GetListSize(this);
  ListVector::SetListSize((Vector *)state,size);
  if (this->vector_type == DICTIONARY_VECTOR) {
    Vector::Slice((Vector *)state,map_data.sel,count);
  }
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType((Vector *)state,CONSTANT_VECTOR);
  }
  Vector::Verify((Vector *)state,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&map_data);
  Vector::~Vector(&child);
  return;
}

Assistant:

static void MapKeyValueFunction(DataChunk &args, ExpressionState &state, Vector &result,
                                Vector &(*get_child_vector)(Vector &)) {
	auto &map = args.data[0];

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	if (map.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	auto count = args.size();
	D_ASSERT(map.GetType().id() == LogicalTypeId::MAP);
	auto child = get_child_vector(map);

	auto &entries = ListVector::GetEntry(result);
	entries.Reference(child);

	UnifiedVectorFormat map_data;
	map.ToUnifiedFormat(count, map_data);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	FlatVector::SetData(result, map_data.data);
	FlatVector::SetValidity(result, map_data.validity);
	auto list_size = ListVector::GetListSize(map);
	ListVector::SetListSize(result, list_size);
	if (map.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		result.Slice(*map_data.sel, count);
	}
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}